

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setRoundingMode(DecimalFormat *this,ERoundingMode roundingMode)

{
  UNumberFormatRoundingMode UVar1;
  bool bVar2;
  UNumberFormatRoundingMode UVar3;
  DecimalFormatProperties *pDVar4;
  UNumberFormatRoundingMode local_18;
  ERoundingMode local_14;
  UNumberFormatRoundingMode uRoundingMode;
  ERoundingMode roundingMode_local;
  DecimalFormat *this_local;
  
  local_18 = roundingMode;
  local_14 = roundingMode;
  _uRoundingMode = this;
  pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  bVar2 = icu_63::number::impl::NullableValue<UNumberFormatRoundingMode>::isNull
                    (&pDVar4->roundingMode);
  UVar1 = local_18;
  if (!bVar2) {
    pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    UVar3 = icu_63::number::impl::NullableValue<UNumberFormatRoundingMode>::getNoError
                      (&pDVar4->roundingMode);
    if (UVar1 == UVar3) {
      return;
    }
  }
  NumberFormat::setMaximumIntegerDigits(&this->super_NumberFormat,local_14);
  pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  icu_63::number::impl::NullableValue<UNumberFormatRoundingMode>::operator=
            (&pDVar4->roundingMode,&local_18);
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setRoundingMode(ERoundingMode roundingMode) {
    auto uRoundingMode = static_cast<UNumberFormatRoundingMode>(roundingMode);
    if (!fields->properties->roundingMode.isNull() && uRoundingMode == fields->properties->roundingMode.getNoError()) {
        return;
    }
    NumberFormat::setMaximumIntegerDigits(roundingMode); // to set field for compatibility
    fields->properties->roundingMode = uRoundingMode;
    touchNoError();
}